

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsJacobianWRTStateSparsity
          (OptimalControlProblem *this,SparsityStructure *stateSparsity)

{
  SparsityStructure *pSVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  OptimalControlProblemPimpl *pOVar8;
  NonZero NVar9;
  NonZero NVar10;
  ostringstream errorMsg;
  long local_1f0;
  string local_1e8;
  SparsityStructure *local_1c8;
  _Rb_tree_node_base *local_1c0;
  _Rb_tree_node_base *local_1b8;
  long local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = stateSparsity;
  SparsityStructure::clear(&this->m_pimpl->stateJacobianSparsity);
  pOVar8 = this->m_pimpl;
  p_Var6 = (pOVar8->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1c0 = &(pOVar8->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != local_1c0) {
    local_1f0 = 0;
    do {
      bVar2 = ConstraintsGroup::constraintJacobianWRTStateSparsity
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var6 + 2),
                         (SparsityStructure *)(*(undefined8 **)(p_Var6 + 2) + 0x23));
      lVar5 = *(long *)(p_Var6 + 2);
      *(bool *)(lVar5 + 0x1e8) = bVar2;
      if (bVar2) {
        sVar3 = SparsityStructure::size((SparsityStructure *)(lVar5 + 0x118));
        if (sVar3 != 0) {
          sVar3 = 0;
          do {
            pOVar8 = this->m_pimpl;
            NVar9 = SparsityStructure::operator[]
                              ((SparsityStructure *)(*(long *)(p_Var6 + 2) + 0x118),sVar3);
            NVar10 = SparsityStructure::operator[]
                               ((SparsityStructure *)(*(long *)(p_Var6 + 2) + 0x118),sVar3);
            SparsityStructure::add(&pOVar8->stateJacobianSparsity,NVar9.row + local_1f0,NVar10.col);
            sVar3 = sVar3 + 1;
            sVar4 = SparsityStructure::size((SparsityStructure *)(*(long *)(p_Var6 + 2) + 0x118));
          } while (sVar3 < sVar4);
        }
      }
      else {
        if ((this->m_pimpl->dynamicalSystem).
            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The group ",10);
          ConstraintsGroup::name_abi_cxx11_
                    (&local_1e8,(ConstraintsGroup *)**(undefined8 **)(p_Var6 + 2));
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                              local_1e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     " has dense state jacobian and no dynamical system has been provided yet. Cannot determine the sparsity since the state dimension is unknown."
                     ,0x8c);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("OptimalControlProblem","constraintJacobianWRTStateSparsity",
                     local_1e8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
          return false;
        }
        lVar5 = iDynTree::MatrixDynSize::rows();
        sVar3 = iDynTree::MatrixDynSize::cols();
        local_1b0 = lVar5;
        if (lVar5 != 0) {
          lVar5 = 0;
          local_1b8 = p_Var6;
          do {
            if (sVar3 != 0) {
              sVar4 = 0;
              do {
                SparsityStructure::add
                          (&this->m_pimpl->stateJacobianSparsity,lVar5 + local_1f0,sVar4);
                sVar4 = sVar4 + 1;
              } while (sVar3 != sVar4);
            }
            lVar5 = lVar5 + 1;
            p_Var6 = local_1b8;
          } while (lVar5 != local_1b0);
        }
      }
      lVar5 = iDynTree::MatrixDynSize::rows();
      local_1f0 = local_1f0 + lVar5;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_1c0);
    pOVar8 = this->m_pimpl;
  }
  pSVar1 = local_1c8;
  if (&pOVar8->stateJacobianSparsity != local_1c8) {
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_1c8,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&pOVar8->stateJacobianSparsity);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&pSVar1->m_nonZeroElementRows,&(pOVar8->stateJacobianSparsity).m_nonZeroElementRows);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&pSVar1->m_nonZeroElementColumns,
             &(pOVar8->stateJacobianSparsity).m_nonZeroElementColumns);
  return true;
}

Assistant:

bool OptimalControlProblem::constraintsJacobianWRTStateSparsity(SparsityStructure &stateSparsity)
        {
            size_t offset = 0;
            m_pimpl->stateJacobianSparsity.clear();
            for (auto& group : m_pimpl->constraintsGroups){

                group.second->hasStateJacobianSparsity = group.second->group_ptr->constraintJacobianWRTStateSparsity(group.second->stateJacobianSparsity);

                if (group.second->hasStateJacobianSparsity) {

                    for (size_t i = 0; i < group.second->stateJacobianSparsity.size(); ++i) {
                        m_pimpl->stateJacobianSparsity.add(group.second->stateJacobianSparsity[i].row + offset,
                                                           group.second->stateJacobianSparsity[i].col);
                    }

                } else {

                    if (m_pimpl->dynamicalSystem) {

                        size_t rows = group.second->stateJacobianBuffer.rows();
                        size_t cols = group.second->stateJacobianBuffer.cols();

                        for (size_t i = 0; i < rows; ++i) {
                            for (size_t j = 0; j < cols; ++j) {
                                m_pimpl->stateJacobianSparsity.add(i + offset, j);
                            }
                        }
                    } else {
                        std::ostringstream errorMsg;
                        errorMsg << "The group " << group.second->group_ptr->name() <<" has dense state jacobian and no dynamical system has been provided yet. Cannot determine the sparsity since the state dimension is unknown.";
                        reportError("OptimalControlProblem", "constraintJacobianWRTStateSparsity", errorMsg.str().c_str());
                        return false;
                    }
                }

                offset += group.second->stateJacobianBuffer.rows();
            }

            stateSparsity = m_pimpl->stateJacobianSparsity;

            return true;
        }